

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1be8a27::AV1ConvolveYHighbdTest_RunTest_Test::TestBody
          (AV1ConvolveYHighbdTest_RunTest_Test *this)

{
  uint src_stride;
  int h;
  int bd;
  int subpel_y_qn;
  ParamType *pPVar1;
  uint16_t *src;
  InterpFilterParams *pIVar2;
  uint height;
  InterpFilterParams *filter_params_y;
  long lVar3;
  uint16_t reference [16384];
  unsigned_short auStack_10060 [16384];
  
  subpel_y_qn = 1;
  do {
    lVar3 = 0;
    do {
      pPVar1 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_int)>_>
               ::GetParam();
      src_stride = (pPVar1->block_).width_;
      pPVar1 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_int)>_>
               ::GetParam();
      h = (pPVar1->block_).height_;
      pPVar1 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_int)>_>
               ::GetParam();
      pIVar2 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + lVar3);
      filter_params_y = (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + lVar3);
      if (4 < h) {
        filter_params_y = pIVar2;
      }
      bd = pPVar1->bd_;
      if (lVar3 == 0x40) {
        filter_params_y = pIVar2;
      }
      pPVar1 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_int)>_>
               ::GetParam();
      src = AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_int)>
            ::FirstRandomInput16
                      ((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_int)>
                        *)this,pPVar1);
      av1_highbd_convolve_y_sr_c
                (src,src_stride,(uint16_t *)&stack0xffffffffffff7fa0,0x80,src_stride,h,
                 filter_params_y,subpel_y_qn,bd);
      pPVar1 = testing::
               WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_int)>_>
               ::GetParam();
      height = src_stride;
      (*pPVar1->test_func_)
                (src,src_stride,auStack_10060,0x80,src_stride,h,filter_params_y,subpel_y_qn,bd);
      AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_int)>
      ::AssertOutputBufferEq
                ((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_int)>
                  *)&stack0xffffffffffff7fa0,auStack_10060,(uint16_t *)(ulong)src_stride,h,height);
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x50);
    subpel_y_qn = subpel_y_qn + 1;
  } while (subpel_y_qn != 0x10);
  return;
}

Assistant:

TEST_P(AV1ConvolveYHighbdTest, RunTest) { RunTest(); }